

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcefile.cpp
# Opt level: O2

int __thiscall
FResourceFile::FilterLumpsByGameType
          (FResourceFile *this,int type,void *lumps,size_t lumpsize,DWORD max)

{
  int iVar1;
  int iVar2;
  long lVar3;
  FString local_58;
  FString filter;
  FString local_38;
  
  if (type == 0) {
    iVar1 = 0;
  }
  else {
    iVar2 = 0;
    for (lVar3 = 8; lVar3 != 0x38; lVar3 = lVar3 + 0x10) {
      if ((*(uint *)((long)&PTR___cxa_pure_virtual_007e5fb8 + lVar3) & type) != 0) {
        FString::FString(&local_38,
                         *(char **)((long)&FilterLumpsByGameType::blanket[0].match + lVar3));
        iVar1 = FilterLumps(this,&local_38,lumps,lumpsize,max);
        iVar2 = iVar2 + iVar1;
        FString::~FString(&local_38);
      }
    }
    FString::FString(&filter,"game-");
    FString::operator+=(&filter,GameNames[type]);
    FString::AttachToOther(&local_58,&filter);
    iVar1 = FilterLumps(this,&local_58,lumps,lumpsize,max);
    iVar1 = iVar1 + iVar2;
    FString::~FString(&local_58);
    FString::~FString(&filter);
  }
  return iVar1;
}

Assistant:

int FResourceFile::FilterLumpsByGameType(int type, void *lumps, size_t lumpsize, DWORD max)
{
	static const struct { int match; const char *name; } blanket[] =
	{
		{ GAME_Raven,			"game-Raven" },
		{ GAME_DoomStrifeChex,	"game-DoomStrifeChex" },
		{ GAME_DoomChex,		"game-DoomChex" },
		{ GAME_Any, NULL }
	};
	if (type == 0)
	{
		return 0;
	}
	int count = 0;
	for (int i = 0; blanket[i].name != NULL; ++i)
	{
		if (type & blanket[i].match)
		{
			count += FilterLumps(blanket[i].name, lumps, lumpsize, max);
		}
	}
	FString filter = "game-";
	filter += GameNames[type];
	return count + FilterLumps(filter, lumps, lumpsize, max);
}